

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZydisTestEncoderAbsolute.c
# Opt level: O0

ZyanBool RunRipRelativeTests(void)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  char *pcVar5;
  undefined1 local_198 [7];
  ZyanBool all_passed;
  ZydisEncoderRequest req;
  
  memset(local_198,0,400);
  local_198._0_4_ = ZYDIS_MACHINE_MODE_LONG_64;
  req.machine_mode = 0x6ee;
  req.address_size_hint._0_1_ = ZYDIS_ADDRESS_SIZE_HINT_32;
  req.operand_count = '\x01';
  req._41_3_ = 0;
  req._44_4_ = 0x35;
  req.operands[0].imm.u._0_4_ = 2;
  req.operands[1].reg.is4 = 0xc5;
  req.operands[1].reg._5_3_ = 0;
  req.operands[1].mem.scale = 'f';
  req.operands[1].mem._9_7_ = 0x666666;
  req.operands[1].mem.displacement._0_2_ = 8;
  pcVar5 = ZydisMnemonicGetString(ZYDIS_MNEMONIC_XOR);
  bVar1 = RunTest((ZydisEncoderRequest *)local_198,pcVar5,'\x01');
  memset(local_198,0,400);
  local_198._0_4_ = ZYDIS_MACHINE_MODE_LONG_64;
  req.machine_mode = 0x6b;
  req.address_size_hint._0_1_ = ZYDIS_ADDRESS_SIZE_HINT_32;
  req.operand_count = '\x02';
  req._41_3_ = 0;
  req.operands[0].reg.is4 = 0xc5;
  req.operands[0].reg._5_3_ = 0;
  req.operands[0].mem.scale = 'f';
  req.operands[0].mem._9_7_ = 0x666666;
  req.operands[0].mem.displacement._0_2_ = 4;
  req.operands[0].imm.u._0_4_ = 4;
  req.operands[1].ptr.segment = 0x3344;
  req.operands[1].ptr._2_2_ = 0x1122;
  req.operands[1].ptr.offset = 0;
  pcVar5 = ZydisMnemonicGetString(ZYDIS_MNEMONIC_CMP);
  bVar2 = RunTest((ZydisEncoderRequest *)local_198,pcVar5,'\x01');
  memset(local_198,0,400);
  local_198._0_4_ = ZYDIS_MACHINE_MODE_LONG_64;
  req.machine_mode = 0x30c;
  req.address_size_hint._0_1_ = ZYDIS_ADDRESS_SIZE_HINT_32;
  req.operand_count = '\x02';
  req._41_3_ = 0;
  req.operands[0].reg.is4 = 0xc4;
  req.operands[0].reg._5_3_ = 0;
  req.operands[0].mem.scale = 'f';
  req.operands[0].mem._9_7_ = 0x666666;
  req.operands[0].mem.displacement._0_2_ = 4;
  req.operands[0].imm.u._0_4_ = 1;
  req.operands[0].imm.u._4_4_ = 0x28;
  pcVar5 = ZydisMnemonicGetString(ZYDIS_MNEMONIC_SUB);
  bVar3 = RunTest((ZydisEncoderRequest *)local_198,pcVar5,'\x01');
  memset(local_198,0,400);
  local_198._0_4_ = ZYDIS_MACHINE_MODE_LONG_64;
  req.machine_mode = 0x23b;
  req.address_size_hint._0_1_ = ZYDIS_ADDRESS_SIZE_HINT_32;
  req.operand_count = '\x01';
  req._41_3_ = 0;
  req._44_4_ = 0x51;
  req.operands[0].imm.u._0_4_ = 2;
  req.operands[1].reg.is4 = 0xc5;
  req.operands[1].reg._5_3_ = 0;
  req.operands[1].mem.scale = 'f';
  req.operands[1].mem._9_7_ = 0x666666;
  req.operands[1].mem.displacement._0_2_ = 8;
  pcVar5 = ZydisMnemonicGetString(ZYDIS_MNEMONIC_PI2FD);
  bVar4 = RunTest((ZydisEncoderRequest *)local_198,pcVar5,'\x01');
  return bVar1 & 1 & bVar2 & bVar3 & bVar4;
}

Assistant:

static ZyanBool RunRipRelativeTests(void)
{
    ZydisEncoderRequest req;
    ZyanBool all_passed = ZYAN_TRUE;

    // Basic test
    ZYAN_MEMSET(&req, 0, sizeof(req));
    req.machine_mode = ZYDIS_MACHINE_MODE_LONG_64;
    req.mnemonic = ZYDIS_MNEMONIC_XOR;
    req.operand_count = 2;
    req.operands[0].type = ZYDIS_OPERAND_TYPE_REGISTER;
    req.operands[0].reg.value = ZYDIS_REGISTER_RAX;
    req.operands[1].type = ZYDIS_OPERAND_TYPE_MEMORY;
    req.operands[1].mem.base = ZYDIS_REGISTER_RIP;
    req.operands[1].mem.displacement = 0x66666666;
    req.operands[1].mem.size = 8;
    all_passed &= RunTest(&req, ZydisMnemonicGetString(req.mnemonic), ZYAN_TRUE);

    // Displacement + immediate
    ZYAN_MEMSET(&req, 0, sizeof(req));
    req.machine_mode = ZYDIS_MACHINE_MODE_LONG_64;
    req.mnemonic = ZYDIS_MNEMONIC_CMP;
    req.operand_count = 2;
    req.operands[0].type = ZYDIS_OPERAND_TYPE_MEMORY;
    req.operands[0].mem.base = ZYDIS_REGISTER_RIP;
    req.operands[0].mem.displacement = 0x66666666;
    req.operands[0].mem.size = 4;
    req.operands[1].type = ZYDIS_OPERAND_TYPE_IMMEDIATE;
    req.operands[1].imm.u = 0x11223344;
    all_passed &= RunTest(&req, ZydisMnemonicGetString(req.mnemonic), ZYAN_TRUE);

    // EIP-relative
    ZYAN_MEMSET(&req, 0, sizeof(req));
    req.machine_mode = ZYDIS_MACHINE_MODE_LONG_64;
    req.mnemonic = ZYDIS_MNEMONIC_SUB;
    req.operand_count = 2;
    req.operands[0].type = ZYDIS_OPERAND_TYPE_MEMORY;
    req.operands[0].mem.base = ZYDIS_REGISTER_EIP;
    req.operands[0].mem.displacement = 0x66666666;
    req.operands[0].mem.size = 4;
    req.operands[1].type = ZYDIS_OPERAND_TYPE_REGISTER;
    req.operands[1].reg.value = ZYDIS_REGISTER_EBX;
    all_passed &= RunTest(&req, ZydisMnemonicGetString(req.mnemonic), ZYAN_TRUE);

    // AMD 3DNow!
    ZYAN_MEMSET(&req, 0, sizeof(req));
    req.machine_mode = ZYDIS_MACHINE_MODE_LONG_64;
    req.mnemonic = ZYDIS_MNEMONIC_PI2FD;
    req.operand_count = 2;
    req.operands[0].type = ZYDIS_OPERAND_TYPE_REGISTER;
    req.operands[0].reg.value = ZYDIS_REGISTER_MM1;
    req.operands[1].type = ZYDIS_OPERAND_TYPE_MEMORY;
    req.operands[1].mem.base = ZYDIS_REGISTER_RIP;
    req.operands[1].mem.displacement = 0x66666666;
    req.operands[1].mem.size = 8;
    all_passed &= RunTest(&req, ZydisMnemonicGetString(req.mnemonic), ZYAN_TRUE);

    return all_passed;
}